

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_ctz_i64_sparc64(TCGContext_conflict8 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2)

{
  TCGOp *pTVar1;
  uintptr_t o_1;
  uintptr_t o;
  
  pTVar1 = tcg_emit_op_sparc64(tcg_ctx,INDEX_op_ctz_i64);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
  pTVar1->args[2] = (TCGArg)(arg2 + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_ctz_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, TCGv_i64 arg2)
{
#if TCG_TARGET_HAS_ctz_i64
        tcg_gen_op3_i64(tcg_ctx, INDEX_op_ctz_i64, ret, arg1, arg2);
#elif TCG_TARGET_HAS_ctpop_i64 || TCG_TARGET_HAS_clz_i64
        TCGv_i64 z, t = tcg_temp_new_i64(tcg_ctx);
#if TCG_TARGET_HAS_ctpop_i64
            tcg_gen_subi_i64(tcg_ctx, t, arg1, 1);
            tcg_gen_andc_i64(tcg_ctx, t, t, arg1);
            tcg_gen_ctpop_i64(tcg_ctx, t, t);
#else
            /* Since all non-x86 hosts have clz(0) == 64, don't fight it.  */
            tcg_gen_neg_i64(tcg_ctx, t, arg1);
            tcg_gen_and_i64(tcg_ctx, t, t, arg1);
            tcg_gen_clzi_i64(tcg_ctx, t, t, 64);
            tcg_gen_xori_i64(tcg_ctx, t, t, 63);
#endif
        z = tcg_const_i64(tcg_ctx, 0);
        tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, ret, arg1, z, arg2, t);
        tcg_temp_free_i64(tcg_ctx, t);
        tcg_temp_free_i64(tcg_ctx, z);
#else
        gen_helper_ctz_i64(tcg_ctx, ret, arg1, arg2);
#endif
}